

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)20>
                 (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double x)

{
  size_t i;
  long lVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> lag;
  vector<double,_std::allocator<double>_> lag_less1;
  _Vector_base<double,_std::allocator<double>_> local_38;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  evalLagrange((vector<double,_std::allocator<double>_> *)&local_38,&current->nodes,&current->coeff,
               x);
  evalLagrange((vector<double,_std::allocator<double>_> *)&local_20,&current->nodes_less1,
               &current->coeff_less1,x);
  dVar2 = ABS(local_38._M_impl.super__Vector_impl_data._M_finish[-1]);
  for (lVar1 = 0;
      (long)local_20._M_impl.super__Vector_impl_data._M_finish -
      (long)local_20._M_impl.super__Vector_impl_data._M_start >> 3 != lVar1; lVar1 = lVar1 + 1) {
    dVar2 = dVar2 + ABS(local_20._M_impl.super__Vector_impl_data._M_start[lVar1] -
                        local_38._M_impl.super__Vector_impl_data._M_start[lVar1]);
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return dVar2;
}

Assistant:

double getValue<rule_mindeltaodd>(CurrentNodes<rule_mindeltaodd> const& current, double x){
    auto lag       = evalLagrange(current.nodes, current.coeff, x);
    auto lag_less1 = evalLagrange(current.nodes_less1, current.coeff_less1, x);

    double result = std::abs(lag.back());
    for(size_t i=0; i<lag_less1.size(); i++) {
        result += std::abs(lag_less1[i] - lag[i]);
    }
    return result;
}